

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChLoadXYZROTnodeBody::ChLoadXYZROTnodeBody
          (ChLoadXYZROTnodeBody *this,shared_ptr<chrono::fea::ChNodeFEAxyzrot> *mnodeA,
          shared_ptr<chrono::ChBody> *mbodyB,ChFrame<double> *abs_application)

{
  element_type *peVar1;
  element_type *peVar2;
  shared_ptr<chrono::ChLoadable> local_88;
  shared_ptr<chrono::ChLoadable> local_78;
  undefined1 local_68 [24];
  double local_50;
  undefined1 local_48 [16];
  double local_38;
  
  peVar1 = (mnodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_78.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_78.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((long)&(peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase +
         (long)(peVar1->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-4]);
  }
  local_78.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mnodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_78.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_78.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_78.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  peVar2 = (mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    local_88.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    local_88.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[-3] + -0x78 +
         (long)(&(peVar2->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord
               + 0xffffffffffffffff) + 0x30);
  }
  local_88.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_88.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_88.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_88.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  ChLoadCustomMultiple::ChLoadCustomMultiple(&this->super_ChLoadCustomMultiple,&local_78,&local_88);
  if (local_88.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadXYZROTnodeBody_00b2b440;
  local_68._0_8_ = 1.0;
  local_68._8_16_ = ZEXT816(0);
  local_50 = 0.0;
  (this->loc_application_A)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  (this->loc_application_A).coord.pos.m_data[0] = 0.0;
  (this->loc_application_A).coord.pos.m_data[1] = 0.0;
  (this->loc_application_A).coord.pos.m_data[2] = 0.0;
  (this->loc_application_A).coord.rot.m_data[0] = 1.0;
  (this->loc_application_A).coord.rot.m_data[1] = 0.0;
  (this->loc_application_A).coord.rot.m_data[2] = 0.0;
  (this->loc_application_A).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33
            (&(this->loc_application_A).Amatrix,(ChQuaternion<double> *)local_68);
  local_68._0_8_ = 1.0;
  local_68._8_16_ = ZEXT816(0);
  local_50 = 0.0;
  (this->loc_application_B)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  (this->loc_application_B).coord.pos.m_data[0] = 0.0;
  (this->loc_application_B).coord.pos.m_data[1] = 0.0;
  (this->loc_application_B).coord.pos.m_data[2] = 0.0;
  (this->loc_application_B).coord.rot.m_data[0] = 1.0;
  (this->loc_application_B).coord.rot.m_data[1] = 0.0;
  (this->loc_application_B).coord.rot.m_data[2] = 0.0;
  (this->loc_application_B).coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33
            (&(this->loc_application_B).Amatrix,(ChQuaternion<double> *)local_68);
  (this->locB_force).m_data[2] = 0.0;
  (this->locB_torque).m_data[0] = 0.0;
  (this->locB_torque).m_data[1] = 0.0;
  (this->locB_torque).m_data[2] = 0.0;
  (this->locB_force).m_data[0] = 0.0;
  (this->locB_force).m_data[1] = 0.0;
  (this->locB_force).m_data[2] = 0.0;
  (this->locB_torque).m_data[0] = 0.0;
  local_68._8_16_ = ZEXT416(0) << 0x40;
  local_68._0_8_ = 1.0;
  local_38 = 0.0;
  local_50 = 0.0;
  local_48 = local_68._8_16_;
  ChFrameMoving<double>::ChFrameMoving
            (&this->frame_Aw,(ChVector<double> *)local_48,(ChQuaternion<double> *)local_68);
  local_68._0_8_ = 1.0;
  local_38 = 0.0;
  local_48 = ZEXT816(0);
  local_68._8_16_ = ZEXT816(0);
  local_50 = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&this->frame_Bw,(ChVector<double> *)local_48,(ChQuaternion<double> *)local_68);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)
             &(((mnodeA->
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
               )->super_ChNodeFEAbase).field_0x18,abs_application,&this->loc_application_A);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)
             &((mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ChBodyFrame,abs_application,&this->loc_application_B);
  return;
}

Assistant:

ChLoadXYZROTnodeBody::ChLoadXYZROTnodeBody(std::shared_ptr<ChNodeFEAxyzrot> mnodeA,
                                           std::shared_ptr<ChBody> mbodyB,
                                           const ChFrame<>& abs_application)
    : ChLoadCustomMultiple(mnodeA, mbodyB) {
    mnodeA->ChFrame::TransformParentToLocal(abs_application, loc_application_A);
    mbodyB->ChFrame::TransformParentToLocal(abs_application, loc_application_B);
}